

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

ggml_backend_graph_copy *
ggml_backend_graph_copy
          (ggml_backend_graph_copy *__return_storage_ptr__,ggml_backend_t backend,ggml_cgraph *graph
          )

{
  int iVar1;
  ggml_hash_set hash_set_00;
  ggml_init_params params;
  ggml_init_params params_00;
  ggml_tensor **node_copies;
  _Bool *node_init;
  ggml_context *ctx_allocated;
  ggml_context *ctx_unallocated;
  ggml_backend_buffer *pgVar2;
  ggml_cgraph *pgVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ggml_hash_set hash_set;
  size_t in_stack_ffffffffffffff78;
  size_t sVar7;
  ggml_bitset_t *in_stack_ffffffffffffff80;
  ggml_tensor **local_78;
  
  ggml_hash_set_new((ggml_hash_set *)&stack0xffffffffffffff78,(graph->visited_hash_set).size);
  sVar7 = in_stack_ffffffffffffff78;
  node_copies = (ggml_tensor **)calloc(in_stack_ffffffffffffff78,8);
  node_init = (_Bool *)calloc(in_stack_ffffffffffffff78,1);
  ggml_tensor_overhead();
  ggml_graph_overhead_custom((long)graph->size,false);
  params.mem_buffer = (void *)sVar7;
  params.mem_size = (size_t)__return_storage_ptr__;
  params._16_8_ = in_stack_ffffffffffffff80;
  ctx_allocated = ggml_init(params);
  params_00.mem_buffer = (void *)sVar7;
  params_00.mem_size = (size_t)__return_storage_ptr__;
  params_00._16_8_ = in_stack_ffffffffffffff80;
  ctx_unallocated = ggml_init(params_00);
  if (ctx_unallocated == (ggml_context *)0x0 || ctx_allocated == (ggml_context *)0x0) {
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate context for graph copy\n",
                      "ggml_backend_graph_copy");
    ggml_hash_set_free((ggml_hash_set *)&stack0xffffffffffffff78);
    free(node_copies);
  }
  else {
    if (0 < graph->n_nodes) {
      lVar6 = 0;
      do {
        hash_set_00.used = in_stack_ffffffffffffff80;
        hash_set_00.size = sVar7;
        hash_set_00.keys = local_78;
        graph_copy_dup_tensor
                  (hash_set_00,node_copies,ctx_allocated,ctx_unallocated,graph->nodes[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < graph->n_nodes);
    }
    pgVar2 = ggml_backend_alloc_ctx_tensors(ctx_allocated,backend);
    if (pgVar2 != (ggml_backend_buffer *)0x0) {
      if (0 < graph->n_nodes) {
        lVar6 = 0;
        do {
          graph_copy_init_tensor
                    ((ggml_hash_set *)&stack0xffffffffffffff78,node_copies,node_init,
                     graph->nodes[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < graph->n_nodes);
      }
      pgVar3 = ggml_new_graph_custom(ctx_allocated,(long)graph->size,false);
      iVar1 = graph->n_nodes;
      if (0 < (long)iVar1) {
        lVar6 = 0;
        do {
          uVar5 = ((ulong)graph->nodes[lVar6] >> 4) % sVar7;
          uVar4 = uVar5;
          do {
            if (((in_stack_ffffffffffffff80[uVar4 >> 5] >> ((uint)uVar4 & 0x1f) & 1) == 0) ||
               (local_78[uVar4] == graph->nodes[lVar6])) goto LAB_001284ed;
            uVar4 = uVar4 + 1;
            if (uVar4 == sVar7) {
              uVar4 = 0;
            }
          } while (uVar4 != uVar5);
          uVar4 = 0xffffffffffffffff;
LAB_001284ed:
          pgVar3->nodes[lVar6] = node_copies[uVar4];
          lVar6 = lVar6 + 1;
        } while (lVar6 != iVar1);
      }
      pgVar3->n_nodes = iVar1;
      ggml_hash_set_free((ggml_hash_set *)&stack0xffffffffffffff78);
      free(node_copies);
      free(node_init);
      __return_storage_ptr__->buffer = pgVar2;
      __return_storage_ptr__->ctx_allocated = ctx_allocated;
      __return_storage_ptr__->ctx_unallocated = ctx_unallocated;
      __return_storage_ptr__->graph = pgVar3;
      return __return_storage_ptr__;
    }
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate buffer for graph copy\n",
                      "ggml_backend_graph_copy");
    ggml_hash_set_free((ggml_hash_set *)&stack0xffffffffffffff78);
    free(node_copies);
  }
  free(node_init);
  ggml_free(ctx_allocated);
  ggml_free(ctx_unallocated);
  __return_storage_ptr__->ctx_unallocated = (ggml_context *)0x0;
  __return_storage_ptr__->graph = (ggml_cgraph *)0x0;
  __return_storage_ptr__->buffer = (ggml_backend_buffer_t)0x0;
  __return_storage_ptr__->ctx_allocated = (ggml_context *)0x0;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_backend_graph_copy ggml_backend_graph_copy(ggml_backend_t backend, struct ggml_cgraph * graph) {
    struct ggml_hash_set hash_set = ggml_hash_set_new(graph->visited_hash_set.size);
    struct ggml_tensor ** node_copies = (ggml_tensor **) calloc(hash_set.size, sizeof(node_copies[0])); // NOLINT
    bool * node_init = (bool *) calloc(hash_set.size, sizeof(node_init[0]));

    struct ggml_init_params params = {
        /* .mem_size   = */ ggml_tensor_overhead()*hash_set.size + ggml_graph_overhead_custom(graph->size, false),
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true
    };

    struct ggml_context * ctx_allocated = ggml_init(params);
    struct ggml_context * ctx_unallocated = ggml_init(params);

    if (ctx_allocated == NULL || ctx_unallocated == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate context for graph copy\n", __func__);
        ggml_hash_set_free(&hash_set);
        free(node_copies);
        free(node_init);
        ggml_free(ctx_allocated);
        ggml_free(ctx_unallocated);
        return {
            /* .buffer           = */ NULL,
            /* .ctx_allocated    = */ NULL,
            /* .ctx_unallocated  = */ NULL,
            /* .graph            = */ NULL,
        };
    }

    // dup nodes
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, node);
    }

    // allocate nodes
    ggml_backend_buffer_t buffer = ggml_backend_alloc_ctx_tensors(ctx_allocated, backend);
    if (buffer == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate buffer for graph copy\n", __func__);
        ggml_hash_set_free(&hash_set);
        free(node_copies);
        free(node_init);
        ggml_free(ctx_allocated);
        ggml_free(ctx_unallocated);
        return {
            /* .buffer           = */ NULL,
            /* .ctx_allocated    = */ NULL,
            /* .ctx_unallocated  = */ NULL,
            /* .graph            = */ NULL,
        };
    }

    //printf("copy buffer size: %zu MB\n", ggml_backend_buffer_get_size(buffer) / 1024 / 1024);

    // copy data and init views
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        graph_copy_init_tensor(&hash_set, node_copies, node_init, node);
    }

    // build graph copy
    struct ggml_cgraph * graph_copy = ggml_new_graph_custom(ctx_allocated, graph->size, false);
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct ggml_tensor * node_copy = node_copies[ggml_hash_find(&hash_set, node)];
        graph_copy->nodes[i] = node_copy;
    }
    graph_copy->n_nodes = graph->n_nodes;

    ggml_hash_set_free(&hash_set);
    free(node_copies);
    free(node_init);

    return {
        /* .buffer           = */ buffer,
        /* .ctx_allocated    = */ ctx_allocated,
        /* .ctx_unallocated  = */ ctx_unallocated,
        /* .graph            = */ graph_copy,
    };
}